

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int exprNodeCanReturnSubtype(Walker *pWalker,Expr *pExpr)

{
  FuncDef *pFVar1;
  char *in_RSI;
  long in_RDI;
  char *unaff_retaddr;
  sqlite3 *db;
  FuncDef *pDef;
  int n;
  u8 in_stack_fffffffffffffffa;
  u8 in_stack_fffffffffffffffb;
  int in_stack_fffffffffffffffc;
  int iVar2;
  
  if (*in_RSI == -0x54) {
    pFVar1 = sqlite3FindFunction(db,unaff_retaddr,in_stack_fffffffffffffffc,
                                 in_stack_fffffffffffffffb,in_stack_fffffffffffffffa);
    if ((pFVar1 == (FuncDef *)0x0) || ((pFVar1->funcFlags & 0x1000000) != 0)) {
      *(undefined2 *)(in_RDI + 0x24) = 1;
      iVar2 = 1;
    }
    else {
      iVar2 = 0;
    }
  }
  else {
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

static int exprNodeCanReturnSubtype(Walker *pWalker, Expr *pExpr){
  int n;
  FuncDef *pDef;
  sqlite3 *db;
  if( pExpr->op!=TK_FUNCTION ){
    return WRC_Prune;
  }
  assert( ExprUseXList(pExpr) );
  db = pWalker->pParse->db;
  n = ALWAYS(pExpr->x.pList) ? pExpr->x.pList->nExpr : 0;
  pDef = sqlite3FindFunction(db, pExpr->u.zToken, n, ENC(db), 0);
  if( NEVER(pDef==0) || (pDef->funcFlags & SQLITE_RESULT_SUBTYPE)!=0 ){
    pWalker->eCode = 1;
    return WRC_Prune;
  }
  return WRC_Continue;
}